

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O2

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::CalcResidualT<double>
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *this,TPZElementMatrixT<double> *ef)

{
  long lVar1;
  int64_t iVar2;
  int iVar3;
  undefined4 uVar4;
  long lVar5;
  long *plVar6;
  ostream *poVar7;
  TPZIntPoints *rval;
  ulong uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  TPZAutoPointer<TPZIntPoints> intrule;
  int order;
  TPZElementMatrixT<double> *pTStack_199f0;
  REAL weight;
  TPZGeoEl *pTStack_199e0;
  long *plStack_199d8;
  long lStack_199d0;
  REAL detJac;
  TPZManVector<int,_3> ordervec;
  TPZManVector<int,_3> intorder;
  TPZManVector<double,_3> intpointtemp;
  TPZManVector<double,_3> intpoint;
  TPZFMatrix<double> jac;
  TPZFMatrix<double> jacInv;
  TPZFMatrix<double> axe;
  TPZManVector<TPZTransform<double>,_10> trvec;
  TPZManVector<TPZMaterialDataT<double>,_3> datavec;
  
  pTStack_199f0 = ef;
  lVar5 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb8))();
  if (lVar5 != 0) {
    plStack_199d8 =
         (long *)__dynamic_cast(lVar5,&TPZMaterial::typeinfo,
                                &TPZMatCombinedSpacesT<double>::typeinfo,0xfffffffffffffffe);
    if (plStack_199d8 != (long *)0x0) {
      (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x100))(this);
      iVar3 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x90))
                        (this);
      if (iVar3 != 0) {
        TPZManVector<TPZMaterialDataT<double>,_3>::TPZManVector(&datavec,0);
        lVar5 = (this->fElementVec).super_TPZVec<TPZCompElSide>.fNElements;
        (*datavec.super_TPZVec<TPZMaterialDataT<double>_>._vptr_TPZVec[3])(&datavec,lVar5);
        (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x288))
                  (this,&datavec,0);
        TPZManVector<TPZTransform<double>,_10>::TPZManVector(&trvec,0);
        (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x280))
                  (this,&trvec);
        iVar3 = (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0xb0))
                          (this);
        TPZAutoPointer<TPZIntPoints>::TPZAutoPointer(&intrule);
        lVar10 = (long)iVar3;
        jac.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)0x0;
        TPZManVector<double,_3>::TPZManVector(&intpoint,lVar10,(double *)&jac);
        jac.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)0x0;
        TPZManVector<double,_3>::TPZManVector(&intpointtemp,lVar10,(double *)&jac);
        weight = 0.0;
        lStack_199d0 = lVar10;
        TPZManVector<int,_3>::TPZManVector(&ordervec,0);
        lVar10 = 0;
        if (lVar5 < 1) {
          lVar5 = lVar10;
        }
        lVar11 = 17000;
        while (bVar13 = lVar5 != 0, lVar5 = lVar5 + -1, bVar13) {
          lVar1 = *(long *)((long)&((this->fElementVec).super_TPZVec<TPZCompElSide>.fStore)->fEl +
                           lVar10);
          if (lVar1 != 0) {
            plVar6 = (long *)__dynamic_cast(lVar1,&TPZCompEl::typeinfo,
                                            &TPZInterpolationSpace::typeinfo,0);
            if (plVar6 != (long *)0x0) {
              TPZManVector<int,_3>::Resize(&ordervec,ordervec.super_TPZVec<int>.fNElements + 1);
              iVar2 = ordervec.super_TPZVec<int>.fNElements;
              uVar4 = (**(code **)(*plVar6 + 0x268))(plVar6);
              *(undefined4 *)
               ((long)((datavec.super_TPZVec<TPZMaterialDataT<double>_>.fStore)->
                      super_TPZMaterialData).super_TPZShapeData.fCornerNodeIds.fExtAlloc +
               lVar11 + -0x30) = uVar4;
              *(undefined4 *)
               ((long)ordervec.super_TPZVec<int>.fStore + ((iVar2 << 0x20) + -0x100000000 >> 0x1e))
                   = uVar4;
            }
          }
          lVar11 = lVar11 + 0x8230;
          lVar10 = lVar10 + 0x10;
        }
        order = (**(code **)(*plStack_199d8 + 0x48))(plStack_199d8,&ordervec);
        pTStack_199e0 = TPZCompEl::Reference((TPZCompEl *)this);
        lVar5 = lStack_199d0;
        iVar3 = (**(code **)(*(long *)pTStack_199e0 + 0xf0))();
        rval = (TPZIntPoints *)
               (**(code **)(*(long *)pTStack_199e0 + 0x70))(pTStack_199e0,iVar3 + -1,order);
        TPZAutoPointer<TPZIntPoints>::operator=(&intrule,rval);
        TPZManVector<int,_3>::TPZManVector(&intorder,lVar5,&order);
        (*(intrule.fRef)->fPointer->_vptr_TPZIntPoints[5])((intrule.fRef)->fPointer,&intorder,0);
        iVar3 = (*(intrule.fRef)->fPointer->_vptr_TPZIntPoints[3])();
        if (1000 < iVar3) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzmultiphysicscompel.cpp"
                     ,0x3c1);
        }
        TPZFMatrix<double>::TPZFMatrix(&jac);
        TPZFMatrix<double>::TPZFMatrix(&axe);
        TPZFMatrix<double>::TPZFMatrix(&jacInv);
        pTStack_199f0 = (TPZElementMatrixT<double> *)&pTStack_199f0->fMat;
        uVar12 = 0;
        uVar8 = (ulong)(uint)datavec.super_TPZVec<TPZMaterialDataT<double>_>.fNElements;
        if ((int)(uint)datavec.super_TPZVec<TPZMaterialDataT<double>_>.fNElements < 1) {
          uVar8 = uVar12;
        }
        if (iVar3 < 1) {
          iVar3 = 0;
        }
        while (iVar9 = (int)uVar12, iVar9 != iVar3) {
          (*(intrule.fRef)->fPointer->_vptr_TPZIntPoints[4])
                    ((intrule.fRef)->fPointer,uVar12,&intpointtemp,&weight);
          TPZGeoEl::Jacobian(pTStack_199e0,&intpointtemp.super_TPZVec<double>,&jac,&axe,&detJac,
                             &jacInv);
          weight = ABS(detJac) * weight;
          for (lVar5 = 0; uVar8 * 0x8230 - lVar5 != 0; lVar5 = lVar5 + 0x8230) {
            *(int *)((long)((datavec.super_TPZVec<TPZMaterialDataT<double>_>.fStore)->sol).fExtAlloc
                           [0].fExtAlloc + lVar5 + -0x50) = iVar9;
          }
          (**(code **)(*(long *)&(this->super_TPZMultiphysicsElement).super_TPZCompEl + 0x2a8))
                    (this,&intpointtemp,&trvec,&datavec);
          (**(code **)(*plStack_199d8 + 0x70))(weight,plStack_199d8,&datavec,pTStack_199f0);
          uVar12 = (ulong)(iVar9 + 1);
        }
        CleanupMaterialDataT<double>(this,&datavec.super_TPZVec<TPZMaterialDataT<double>_>);
        TPZFMatrix<double>::~TPZFMatrix(&jacInv);
        TPZFMatrix<double>::~TPZFMatrix(&axe);
        TPZFMatrix<double>::~TPZFMatrix(&jac);
        TPZManVector<int,_3>::~TPZManVector(&intorder);
        TPZManVector<int,_3>::~TPZManVector(&ordervec);
        TPZManVector<double,_3>::~TPZManVector(&intpointtemp);
        TPZManVector<double,_3>::~TPZManVector(&intpoint);
        TPZAutoPointer<TPZIntPoints>::~TPZAutoPointer(&intrule);
        TPZManVector<TPZTransform<double>,_10>::~TPZManVector(&trvec);
        TPZManVector<TPZMaterialDataT<double>,_3>::~TPZManVector(&datavec);
      }
      return;
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cerr,"Error at ");
  poVar7 = std::operator<<(poVar7,
                           "void TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::CalcResidualT(TPZElementMatrixT<TVar> &) [TGeometry = pzgeom::TPZGeoCube, TVar = double]"
                          );
  std::operator<<(poVar7," this->Material() == NULL\n");
  TPZElementMatrixT<double>::Reset(pTStack_199f0,(TPZCompMesh *)0x0,Unknown);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::CalcResidualT(TPZElementMatrixT<TVar> &ef)
{
    TPZMaterial * material = Material();
    auto *matCombined =
       dynamic_cast<TPZMatCombinedSpacesT<TVar>*>(material);
    if(!material || !matCombined){
        PZError << "Error at " << __PRETTY_FUNCTION__ << " this->Material() == NULL\n";
        ef.Reset();
        return;
    }
    
    InitializeElementMatrix(ef);
    
    if (this->NConnects() == 0) return;//boundary discontinuous elements have this characteristic
    
    TPZManVector<TPZMaterialDataT<TVar>,3> datavec;
    const int64_t nref = fElementVec.size();
    datavec.resize(nref);
    InitMaterialData(datavec);
    
    TPZManVector<TPZTransform<> > trvec;
    AffineTransform(trvec);
    
    int dim = Dimension();
    TPZAutoPointer<TPZIntPoints> intrule;
    
    TPZManVector<REAL,3> intpoint(dim,0.), intpointtemp(dim,0.);
    REAL weight = 0.;
    
    TPZManVector<int,3> ordervec;
    //ordervec.resize(nref);
    for (int64_t iref=0;  iref<nref; iref++)
    {
        TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
        int svec;
        if(msp)
        {
            ordervec.Resize(ordervec.size()+1);
            svec = ordervec.size();
        }
        else
        {
            continue;
        }
        datavec[iref].p = msp->MaxOrder();
        ordervec[svec-1] = datavec[iref].p;
    }
    int order = matCombined->IntegrationRuleOrder(ordervec);
    
    TPZGeoEl *ref = this->Reference();
    intrule = ref->CreateSideIntegrationRule(ref->NSides()-1, order);
    
    TPZManVector<int,3> intorder(dim,order);
    intrule->SetOrder(intorder);
    int intrulepoints = intrule->NPoints();
    if(intrulepoints > 1000) {
        DebugStop();
    }
    
    TPZFMatrix<REAL> jac, axe, jacInv;
    REAL detJac;
    int nmeshes = datavec.size();
    for(int int_ind = 0; int_ind < intrulepoints; ++int_ind)
    {
        intrule->Point(int_ind,intpointtemp,weight);
        ref->Jacobian(intpointtemp, jac, axe, detJac , jacInv);
        weight *= fabs(detJac);
        for (int imesh = 0; imesh < nmeshes; imesh++) {
            datavec[imesh].intLocPtIndex = int_ind;
        }
        
        
        this->ComputeRequiredData(intpointtemp,trvec,datavec);
        
        matCombined->Contribute(datavec,weight,ef.fMat);
    }//loop over integratin points
    
    CleanupMaterialData(datavec);
    
}